

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O0

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrPolicies
          (Interface_ProblemToPolicyDiscretePure *this,Index ag,PolicyDomainCategory cat,
          size_t depth)

{
  EOverflow *pEVar1;
  long lVar2;
  char *arg;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  LIndex nrPolsOld;
  size_t k;
  LIndex nrPols;
  EOverflow *this_00;
  EOverflow *local_28;
  ulong local_20;
  
  local_20 = 1;
  local_28 = (EOverflow *)0x0;
  while( true ) {
    this_00 = local_28;
    pEVar1 = (EOverflow *)(**(code **)(*in_RDI + 0x28))(in_RDI,in_ESI,in_EDX,in_RCX);
    if (this_00 == pEVar1) {
      return local_20;
    }
    lVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_ESI);
    if (lVar2 * local_20 < local_20) break;
    local_28 = (EOverflow *)((long)&(local_28->super_E)._vptr_E + 1);
    local_20 = lVar2 * local_20;
  }
  arg = (char *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,arg);
  __cxa_throw(arg,&EOverflow::typeinfo,EOverflow::~EOverflow);
}

Assistant:

LIndex GetNrPolicies(Index ag,
                             PolicyGlobals::PolicyDomainCategory cat, 
                             size_t depth=MAXHORIZON) const
        {        
#if 0 // don't use powl(), we want to detect overflow
            LIndex nr_pols = 
                static_cast<LIndex>(
                    powl( GetNrActions(ag),
                          GetNrPolicyDomainElements(ag,cat,depth) ));
#endif
            LIndex nrPols=1;
            for(size_t k=0;k!=GetNrPolicyDomainElements(ag,cat,depth);++k)
            {
                LIndex nrPolsOld=nrPols;
                nrPols*=GetNrActions(ag);
                if(nrPols<nrPolsOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrPolicies() overflow detected"));
            }
            return(nrPols);
        }